

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOBLoader.cpp
# Opt level: O3

void __thiscall Assimp::LWOImporter::LoadLWOBFile(LWOImporter *this)

{
  uint uVar1;
  uint uVar2;
  Logger *this_00;
  runtime_error *this_01;
  uint *puVar4;
  uint *puVar5;
  uint uVar6;
  char *message;
  uint *puVar7;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  ulong uVar3;
  
  if (7 < (ulong)this->fileSize) {
    puVar5 = (uint *)this->mFileBuffer;
    puVar7 = (uint *)((ulong)this->fileSize + (long)puVar5);
    puVar4 = puVar5 + 2;
    do {
      uVar6 = *puVar5;
      this->mFileBuffer = (uint8_t *)(puVar5 + 1);
      uVar1 = puVar5[1];
      this->mFileBuffer = (uint8_t *)puVar4;
      uVar2 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 |
              (uint)(((ulong)uVar6 << 0x20) >> 0x18) & 0xff0000 |
              (uint)(((ulong)uVar6 << 0x20) >> 8);
      uVar3 = ((ulong)uVar1 & 0xff000000) << 8 | ((ulong)uVar1 & 0xff0000) << 0x18 |
              ((ulong)uVar1 & 0xff00) << 0x28 | CONCAT44(uVar6,uVar1) << 0x38;
      puVar5 = (uint *)((long)puVar4 + (uVar3 >> 0x20));
      if (puVar7 < puVar5) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_50,"LWOB: Invalid chunk length","");
        std::runtime_error::runtime_error(this_01,(string *)local_50);
        *(undefined ***)this_01 = &PTR__runtime_error_008bf448;
        __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar6 = (uint)(uVar3 >> 0x20);
      if ((int)uVar2 < 0x53524653) {
        if (uVar2 == 0x504e5453) {
          if ((this->mCurLayer->mTempPoints).
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
              super__Vector_impl_data._M_start ==
              (this->mCurLayer->mTempPoints).
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            LoadLWOPoints(this,uVar6);
          }
          else {
            this_00 = DefaultLogger::get();
            message = "LWO: PNTS chunk encountered twice";
LAB_006fffe5:
            Logger::warn(this_00,message);
          }
        }
        else if (uVar2 == 0x504f4c53) {
          if ((this->mCurLayer->mFaces).
              super__Vector_base<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>._M_impl.
              super__Vector_impl_data._M_start !=
              (this->mCurLayer->mFaces).
              super__Vector_base<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            this_00 = DefaultLogger::get();
            message = "LWO: POLS chunk encountered twice";
            goto LAB_006fffe5;
          }
          LoadLWOBPolygons(this,uVar6);
        }
      }
      else if (uVar2 == 0x53524653) {
        if ((this->mTags->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start !=
            (this->mTags->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish) {
          this_00 = DefaultLogger::get();
          message = "LWO: SRFS chunk encountered twice";
          goto LAB_006fffe5;
        }
        LoadLWOTags(this,uVar6);
      }
      else if (uVar2 == 0x53555246) {
        LoadLWOBSurface(this,uVar6);
      }
      this->mFileBuffer = (uint8_t *)puVar5;
      puVar4 = puVar5 + 2;
    } while (puVar4 <= puVar7);
  }
  return;
}

Assistant:

void LWOImporter::LoadLWOBFile()
{
    LE_NCONST uint8_t* const end = mFileBuffer + fileSize;
    bool running = true;
    while (running)
    {
        if (mFileBuffer + sizeof(IFF::ChunkHeader) > end)break;
        const IFF::ChunkHeader head = IFF::LoadChunk(mFileBuffer);

        if (mFileBuffer + head.length > end)
        {
            throw DeadlyImportError("LWOB: Invalid chunk length");
            break;
        }
        uint8_t* const next = mFileBuffer+head.length;
        switch (head.type)
        {
            // vertex list
        case AI_LWO_PNTS:
            {
                if (!mCurLayer->mTempPoints.empty())
                    ASSIMP_LOG_WARN("LWO: PNTS chunk encountered twice");
                else LoadLWOPoints(head.length);
                break;
            }
            // face list
        case AI_LWO_POLS:
            {

                if (!mCurLayer->mFaces.empty())
                    ASSIMP_LOG_WARN("LWO: POLS chunk encountered twice");
                else LoadLWOBPolygons(head.length);
                break;
            }
            // list of tags
        case AI_LWO_SRFS:
            {
                if (!mTags->empty())
                    ASSIMP_LOG_WARN("LWO: SRFS chunk encountered twice");
                else LoadLWOTags(head.length);
                break;
            }

            // surface chunk
        case AI_LWO_SURF:
            {
                LoadLWOBSurface(head.length);
                break;
            }
        }
        mFileBuffer = next;
    }
}